

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O1

void __thiscall
MT32Emu::BReverbModelImpl<short>::setParameters
          (BReverbModelImpl<short> *this,Bit8u time,Bit8u level)

{
  bool bVar1;
  Bit32u BVar2;
  BReverbSettings *pBVar3;
  CombFilter<short> *pCVar4;
  CombFilter<short> **ppCVar5;
  Bit8u *pBVar6;
  int iVar7;
  uint uVar8;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar9;
  
  iVar7 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])();
  if ((char)iVar7 != '\0') {
    uVar8 = level & 7;
    uVar9 = (ulong)uVar8;
    bVar10 = time & 7;
    bVar1 = this->tapDelayMode;
    if (bVar1 == false) {
      uVar11 = (ulong)this->currentSettings->numberOfCombs;
      if (1 < uVar11) {
        ppCVar5 = this->combs;
        pBVar6 = this->currentSettings->feedbackFactors;
        uVar12 = 8;
        do {
          *(Bit8u *)(*(long *)((long)ppCVar5 + uVar12) + 0x19) =
               pBVar6[uVar12 & 0xffffffff | (ulong)bVar10];
          uVar12 = uVar12 + 8;
        } while (uVar11 << 3 != uVar12);
      }
    }
    else {
      pBVar3 = this->currentSettings;
      pCVar4 = *this->combs;
      BVar2 = pBVar3->outRPositions[bVar10];
      *(Bit32u *)&pCVar4->field_0x1c = pBVar3->outLPositions[bVar10];
      *(Bit32u *)&pCVar4[1].super_RingBuffer<short>._vptr_RingBuffer = BVar2;
      pCVar4->feedbackFactor = pBVar3->feedbackFactors[5 < bVar10 && 2 < (byte)uVar8];
    }
    if (((level | time) & 7) == 0) {
      this->dryAmp = '\0';
      this->wetLevel = '\0';
    }
    else {
      if ((bVar1 != false) && ((bVar10 == 0 || ((byte)uVar8 == 1 && bVar10 == 1)))) {
        uVar8 = uVar8 + 8;
      }
      this->dryAmp = this->currentSettings->dryAmps[uVar8];
      this->wetLevel = this->currentSettings->wetLevels[uVar9];
    }
  }
  return;
}

Assistant:

void setParameters(Bit8u time, Bit8u level) {
		if (!isOpen()) return;
		level &= 7;
		time &= 7;
		if (tapDelayMode) {
			TapDelayCombFilter<Sample> *comb = static_cast<TapDelayCombFilter<Sample> *> (*combs);
			comb->setOutputPositions(currentSettings.outLPositions[time], currentSettings.outRPositions[time & 7]);
			comb->setFeedbackFactor(currentSettings.feedbackFactors[((level < 3) || (time < 6)) ? 0 : 1]);
		} else {
			for (Bit32u i = 1; i < currentSettings.numberOfCombs; i++) {
				combs[i]->setFeedbackFactor(currentSettings.feedbackFactors[(i << 3) + time]);
			}
		}
		if (time == 0 && level == 0) {
			dryAmp = wetLevel = 0;
		} else {
			if (tapDelayMode && ((time == 0) || (time == 1 && level == 1))) {
				// Looks like MT-32 implementation has some minor quirks in this mode:
				// for odd level values, the output level changes sometimes depending on the time value which doesn't seem right.
				dryAmp = currentSettings.dryAmps[level + 8];
			} else {
				dryAmp = currentSettings.dryAmps[level];
			}
			wetLevel = currentSettings.wetLevels[level];
		}
	}